

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

Matrix<double> * __thiscall nnad::Matrix<double>::Adjoint(Matrix<double> *this)

{
  int *in_RSI;
  Matrix<double> *in_RDI;
  Matrix<double> Cofactor;
  int j;
  int i;
  int sign;
  Matrix<double> *output;
  allocator<char> *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int iVar1;
  undefined4 in_stack_ffffffffffffff94;
  int iVar2;
  uint in_stack_ffffffffffffffb8;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  Matrix<double> *in_stack_ffffffffffffffc8;
  Matrix<double> *in_stack_ffffffffffffffd0;
  Matrix<double> *in_stack_ffffffffffffffd8;
  
  if (*in_RSI != in_RSI[1]) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
              );
    Error((string *)0x1031f6);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  }
  uVar3 = in_stack_ffffffffffffffb8 & 0xffffff;
  Matrix((Matrix<double> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
         in_stack_ffffffffffffff88,(int *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (*in_RSI == 1) {
    SetElement(in_stack_ffffffffffffffd0,&in_stack_ffffffffffffffc8->_Lines,
               (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (double *)CONCAT44(in_stack_ffffffffffffffbc,uVar3));
  }
  else {
    for (iVar2 = 0; iVar2 < *in_RSI; iVar2 = iVar2 + 1) {
      for (iVar1 = 0; iVar1 < in_RSI[1]; iVar1 = iVar1 + 1) {
        GetCofactor(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
        Determinant(in_stack_ffffffffffffffd8);
        SetElement(in_stack_ffffffffffffffd0,&in_stack_ffffffffffffffc8->_Lines,
                   (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (double *)CONCAT44(in_stack_ffffffffffffffbc,uVar3));
        ~Matrix((Matrix<double> *)0x1033cd);
      }
    }
  }
  return in_RDI;
}

Assistant:

Matrix<T> Adjoint()
    {
      if (_Lines != _Columns)
        Error("Adjoint: matrix must be square.");

      Matrix<T> output{_Lines, _Columns};

      if (_Lines == 1)
        {
          output.SetElement(0,0, T{1});
          return output;
        }
      int sign = 1;

      for (int i = 0; i < _Lines; i++)
        for (int j = 0; j < _Columns; j++)
          {
            // Get cofactor
            Matrix<T> Cofactor = this->GetCofactor(i, j);

            // sign of adj[j][i] positive if sum of row
            // and column indexes is even.
            sign = ((i + j) % 2 == 0) ? 1 : -1;

            // Interchanging rows and columns to get the
            // transpose of the cofactor matrix
            output.SetElement(j, i, (sign) * Cofactor.Determinant());
          }
      return output;
    }